

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ObjPrintVerbose(Hop_Obj_t *pObj,int fHaig)

{
  int iVar1;
  uint uVar2;
  Hop_Obj_t *pHVar3;
  char *pcVar4;
  Hop_Obj_t *pHVar5;
  char *pcVar6;
  int fHaig_local;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x1ca,"void Hop_ObjPrintVerbose(Hop_Obj_t *, int)");
  }
  printf("Node %p : ",pObj);
  iVar1 = Hop_ObjIsConst1(pObj);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsPi(pObj);
    if (iVar1 == 0) {
      pHVar3 = Hop_ObjFanin0(pObj);
      iVar1 = Hop_ObjFaninC0(pObj);
      pcVar4 = " ";
      if (iVar1 != 0) {
        pcVar4 = "\'";
      }
      pHVar5 = Hop_ObjFanin1(pObj);
      iVar1 = Hop_ObjFaninC1(pObj);
      pcVar6 = " ";
      if (iVar1 != 0) {
        pcVar6 = "\'";
      }
      printf("AND( %p%s, %p%s )",pHVar3,pcVar4,pHVar5,pcVar6);
    }
    else {
      printf("PI");
    }
  }
  else {
    printf("constant 1");
  }
  uVar2 = Hop_ObjRefs(pObj);
  printf(" (refs = %3d)",(ulong)uVar2);
  return;
}

Assistant:

void Hop_ObjPrintVerbose( Hop_Obj_t * pObj, int fHaig )
{
    assert( !Hop_IsComplement(pObj) );
    printf( "Node %p : ", pObj );
    if ( Hop_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Hop_ObjIsPi(pObj) )
        printf( "PI" );
    else
        printf( "AND( %p%s, %p%s )", 
            Hop_ObjFanin0(pObj), (Hop_ObjFaninC0(pObj)? "\'" : " "), 
            Hop_ObjFanin1(pObj), (Hop_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Hop_ObjRefs(pObj) );
}